

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

void __thiscall
capnp::compiler::CompilerMain::readOneAndConvert
          (CompilerMain *this,BufferedInputStreamWrapper *input,OutputStream *output)

{
  RawBrandedSchema *pRVar1;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Builder output_00;
  Reader reader_02;
  Reader reader_03;
  Builder output_01;
  Reader reader_04;
  uchar *puVar2;
  RemoveConst<unsigned_char> *pRVar3;
  uchar *puVar4;
  bool bVar5;
  InputStream __dest;
  Disposer *firstElement;
  size_t sVar6;
  capnp *pcVar7;
  size_t extraout_RDX;
  ulong uVar8;
  capnp *pcVar9;
  word *ptrCopy;
  Impl *pIVar10;
  ReaderOptions options;
  ReaderOptions options_00;
  ReaderOptions options_01;
  ReaderOptions options_02;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_char> input_00;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_unsigned_char> array;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  StringPtr input_01;
  Vector<unsigned_char> allBytes;
  Array<capnp::word> words;
  Fault f;
  Fault f_1;
  PackedInputStream unpacker;
  ArrayPtr<const_capnp::word> segments [1];
  word dummy;
  SegmentArrayMessageReader message;
  ArrayPtr<const_capnp::word> segments_1 [1];
  ParseErrorCatcher parseErrorCatcher;
  Vector<unsigned_char> local_4a8;
  JsonCodec local_488;
  undefined8 *local_478;
  undefined1 local_468 [16];
  WirePointer *local_458;
  int iStack_450;
  undefined4 uStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  PointerReader local_438;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  PackedInputStream local_3f8;
  ArrayInputStream local_3e8;
  undefined1 local_3d0 [8];
  PackedMessageReader local_3c8;
  StructReader local_288;
  StructReader local_258;
  StructReader local_228;
  StructReader local_1f8;
  ArrayPtr<const_capnp::word> local_1c8;
  ParseErrorCatcher local_1b0;
  
  ParseErrorCatcher::ParseErrorCatcher(&local_1b0,this->context);
  switch(this->convertFrom) {
  case BINARY:
    options._8_8_ = 0x7fffffff;
    options.traversalLimitInWords = 0xffffffffffffffff;
    InputStreamMessageReader::InputStreamMessageReader
              ((InputStreamMessageReader *)&local_3c8,(InputStream *)input,options,
               (ArrayPtr<capnp::word>)ZEXT816(0));
    MessageReader::getRootInternal((Reader *)local_468,(MessageReader *)&local_3c8);
    local_438.pointer = local_458;
    local_438.nestingLimit = iStack_450;
    local_438._28_4_ = uStack_44c;
    local_438.segment = (SegmentReader *)local_468._0_8_;
    local_438.capTable = (CapTableReader *)local_468._8_8_;
    capnp::_::PointerReader::getStruct(&local_1f8,&local_438,(word *)0x0);
    reader_00._reader.capTable = local_1f8.capTable;
    reader_00._reader.segment = local_1f8.segment;
    reader_00._reader.data = local_1f8.data;
    reader_00._reader.pointers = local_1f8.pointers;
    reader_00._reader.dataSize = local_1f8.dataSize;
    reader_00._reader.pointerCount = local_1f8.pointerCount;
    reader_00._reader._38_2_ = local_1f8._38_2_;
    reader_00._reader.nestingLimit = local_1f8.nestingLimit;
    reader_00._reader._44_4_ = local_1f8._44_4_;
    writeConversion(this,reader_00,output);
    InputStreamMessageReader::~InputStreamMessageReader((InputStreamMessageReader *)&local_3c8);
    break;
  case PACKED:
    options_00._8_8_ = 0x7fffffff;
    options_00.traversalLimitInWords = 0xffffffffffffffff;
    PackedMessageReader::PackedMessageReader
              (&local_3c8,&input->super_BufferedInputStream,options_00,
               (ArrayPtr<capnp::word>)ZEXT816(0));
    MessageReader::getRootInternal
              ((Reader *)local_468,&local_3c8.super_InputStreamMessageReader.super_MessageReader);
    local_438.pointer = local_458;
    local_438.nestingLimit = iStack_450;
    local_438._28_4_ = uStack_44c;
    local_438.segment = (SegmentReader *)local_468._0_8_;
    local_438.capTable = (CapTableReader *)local_468._8_8_;
    capnp::_::PointerReader::getStruct(&local_228,&local_438,(word *)0x0);
    reader_01._reader.capTable = local_228.capTable;
    reader_01._reader.segment = local_228.segment;
    reader_01._reader.data = local_228.data;
    reader_01._reader.pointers = local_228.pointers;
    reader_01._reader.dataSize = local_228.dataSize;
    reader_01._reader.pointerCount = local_228.pointerCount;
    reader_01._reader._38_2_ = local_228._38_2_;
    reader_01._reader.nestingLimit = local_228.nestingLimit;
    reader_01._reader._44_4_ = local_228._44_4_;
    writeConversion(this,reader_01,output);
    PackedMessageReader::~PackedMessageReader(&local_3c8);
    break;
  case FLAT:
  case CANONICAL:
    readAll(&local_4a8,this,input);
    uVar8 = (long)local_4a8.builder.pos - (long)local_4a8.builder.ptr;
    pIVar10 = (Impl *)(uVar8 >> 3);
    __dest._vptr_InputStream =
         (_func_int **)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,(size_t)pIVar10,(size_t)pIVar10,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    local_478 = &kj::_::HeapArrayDisposer::instance;
    local_488.impl.disposer = (Disposer *)__dest._vptr_InputStream;
    local_488.impl.ptr = pIVar10;
    memcpy(__dest._vptr_InputStream,local_4a8.builder.ptr,uVar8 & 0xfffffffffffffff8);
    options_01._8_8_ = 0x7fffffff;
    options_01.traversalLimitInWords = 0xffffffffffffffff;
    segments_00.size_ = 1;
    segments_00.ptr = (ArrayPtr<const_capnp::word> *)&local_3e8;
    local_3e8.super_BufferedInputStream.super_InputStream._vptr_InputStream =
         (InputStream)(InputStream)__dest._vptr_InputStream;
    local_3e8.array.ptr = (uchar *)pIVar10;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)&local_3c8,segments_00,options_01);
    if ((this->convertFrom == CANONICAL) &&
       (bVar5 = MessageReader::isCanonical((MessageReader *)&local_3c8), !bVar5)) {
      local_468._0_8_ = (Exception *)0x0;
      local_438.segment = (SegmentReader *)0x0;
      local_438.capTable = (CapTableReader *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)local_468,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)local_468);
    }
    MessageReader::getRootInternal((Reader *)local_468,(MessageReader *)&local_3c8);
    local_438.pointer = local_458;
    local_438.nestingLimit = iStack_450;
    local_438._28_4_ = uStack_44c;
    local_438.segment = (SegmentReader *)local_468._0_8_;
    local_438.capTable = (CapTableReader *)local_468._8_8_;
    capnp::_::PointerReader::getStruct(&local_258,&local_438,(word *)0x0);
    reader._reader.capTable = local_258.capTable;
    reader._reader.segment = local_258.segment;
    reader._reader.data = local_258.data;
    reader._reader.pointers = local_258.pointers;
    reader._reader.dataSize = local_258.dataSize;
    reader._reader.pointerCount = local_258.pointerCount;
    reader._reader._38_2_ = local_258._38_2_;
    reader._reader.nestingLimit = local_258.nestingLimit;
    reader._reader._44_4_ = local_258._44_4_;
    writeConversion(this,reader,output);
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)&local_3c8);
    if (__dest._vptr_InputStream != (_func_int **)0x0) {
      local_488.impl.disposer = (Disposer *)0x0;
      local_488.impl.ptr = (Impl *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,__dest._vptr_InputStream,8
                 ,(size_t)pIVar10,(size_t)pIVar10,(_func_void_void_ptr *)0x0);
    }
    puVar4 = local_4a8.builder.endPtr;
    pRVar3 = local_4a8.builder.pos;
    puVar2 = local_4a8.builder.ptr;
    if ((capnp *)local_4a8.builder.ptr != (capnp *)0x0) {
      local_4a8.builder.ptr = (uchar *)0x0;
      local_4a8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      local_4a8.builder.endPtr = (uchar *)0x0;
      (**(local_4a8.builder.disposer)->_vptr_ArrayDisposer)
                (local_4a8.builder.disposer,puVar2,1,(long)pRVar3 - (long)puVar2,
                 (long)puVar4 - (long)puVar2,0);
    }
    break;
  case FLAT_PACKED:
    readAll(&local_4a8,this,input);
    packedBytes.ptr = (capnp *)(local_4a8.builder.pos + -(long)local_4a8.builder.ptr);
    packedBytes.size_ = extraout_RDX;
    pIVar10 = (Impl *)computeUnpackedSizeInWords((capnp *)local_4a8.builder.ptr,packedBytes);
    firstElement = (Disposer *)
                   kj::_::HeapArrayDisposer::allocateImpl
                             (8,(size_t)pIVar10,(size_t)pIVar10,(_func_void_void_ptr *)0x0,
                              (_func_void_void_ptr *)0x0);
    local_478 = &kj::_::HeapArrayDisposer::instance;
    array.size_ = (long)local_4a8.builder.pos - (long)local_4a8.builder.ptr;
    array.ptr = local_4a8.builder.ptr;
    local_488.impl.disposer = firstElement;
    local_488.impl.ptr = pIVar10;
    kj::ArrayInputStream::ArrayInputStream(&local_3e8,array);
    capnp::_::PackedInputStream::PackedInputStream(&local_3f8,&local_3e8.super_BufferedInputStream);
    kj::InputStream::read
              (&local_3f8.super_InputStream,(int)firstElement,(void *)((long)pIVar10 << 3),
               (size_t)((long)pIVar10 << 3));
    sVar6 = capnp::_::PackedInputStream::tryRead(&local_3f8,local_3d0,8,8);
    if (sVar6 != 0) {
      local_438.segment = (SegmentReader *)0x0;
      local_3c8.super_PackedInputStream.super_InputStream._vptr_InputStream = (_func_int **)0x0;
      local_3c8.super_PackedInputStream.inner = (BufferedInputStream *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_438,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_438);
    }
    options_02._8_8_ = 0x7fffffff;
    options_02.traversalLimitInWords = 0xffffffffffffffff;
    segments_01.size_ = 1;
    segments_01.ptr = &local_1c8;
    local_1c8.ptr = (word *)firstElement;
    local_1c8.size_ = (size_t)pIVar10;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)&local_3c8,segments_01,options_02);
    MessageReader::getRootInternal((Reader *)local_468,(MessageReader *)&local_3c8);
    local_438.pointer = local_458;
    local_438.nestingLimit = iStack_450;
    local_438._28_4_ = uStack_44c;
    local_438.segment = (SegmentReader *)local_468._0_8_;
    local_438.capTable = (CapTableReader *)local_468._8_8_;
    capnp::_::PointerReader::getStruct(&local_288,&local_438,(word *)0x0);
    reader_03._reader.capTable = local_288.capTable;
    reader_03._reader.segment = local_288.segment;
    reader_03._reader.data = local_288.data;
    reader_03._reader.pointers = local_288.pointers;
    reader_03._reader.dataSize = local_288.dataSize;
    reader_03._reader.pointerCount = local_288.pointerCount;
    reader_03._reader._38_2_ = local_288._38_2_;
    reader_03._reader.nestingLimit = local_288.nestingLimit;
    reader_03._reader._44_4_ = local_288._44_4_;
    writeConversion(this,reader_03,output);
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)&local_3c8);
    capnp::_::PackedInputStream::~PackedInputStream(&local_3f8);
    kj::BufferedInputStream::~BufferedInputStream(&local_3e8.super_BufferedInputStream);
    if (firstElement != (Disposer *)0x0) {
      local_488.impl.disposer = (Disposer *)0x0;
      local_488.impl.ptr = (Impl *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,8,
                 (size_t)pIVar10,(size_t)pIVar10,(_func_void_void_ptr *)0x0);
    }
    puVar4 = local_4a8.builder.endPtr;
    pRVar3 = local_4a8.builder.pos;
    puVar2 = local_4a8.builder.ptr;
    if ((capnp *)local_4a8.builder.ptr != (capnp *)0x0) {
      local_4a8.builder.ptr = (uchar *)0x0;
      local_4a8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      local_4a8.builder.endPtr = (uchar *)0x0;
      (**(local_4a8.builder.disposer)->_vptr_ArrayDisposer)
                (local_4a8.builder.disposer,puVar2,1,(long)pRVar3 - (long)puVar2,
                 (long)puVar4 - (long)puVar2,0);
    }
    break;
  case TEXT:
    readOneText((String *)&local_4a8,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)&local_3c8,0x400,GROW_HEURISTICALLY);
    TextCodec::TextCodec((TextCodec *)&local_488);
    TextCodec::setPrettyPrint((TextCodec *)&local_488,this->pretty);
    pRVar1 = (this->rootType).super_Schema.raw;
    MessageBuilder::getRootInternal((Builder *)&local_438,(MessageBuilder *)&local_3c8);
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
              ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)local_468,
               (EVP_PKEY_CTX *)pRVar1);
    pcVar9 = (capnp *)local_4a8.builder.ptr;
    if ((capnp *)local_4a8.builder.pos == (capnp *)0x0) {
      pcVar9 = (capnp *)0x2781dd;
    }
    input_01.content.size_ =
         (capnp *)(local_4a8.builder.pos + ((capnp *)local_4a8.builder.pos == (capnp *)0x0));
    output_01.builder.segment = (SegmentBuilder *)local_468._8_8_;
    output_01.schema.super_Schema.raw = (Schema)(Schema)local_468._0_8_;
    output_01.builder.capTable = (CapTableBuilder *)local_458;
    output_01.builder.data = (void *)_iStack_450;
    output_01.builder.pointers = (WirePointer *)local_448;
    output_01.builder.dataSize = (undefined4)uStack_440;
    output_01.builder.pointerCount = uStack_440._4_2_;
    output_01.builder._38_2_ = uStack_440._6_2_;
    input_01.content.ptr = (char *)pcVar9;
    TextCodec::decode((TextCodec *)&local_488,input_01,output_01);
    capnp::_::StructBuilder::asReader((StructBuilder *)(local_468 + 8));
    local_438.segment = (SegmentReader *)local_468._0_8_;
    reader_04._reader.capTable = (CapTableReader *)local_438.pointer;
    reader_04._reader.segment = (SegmentReader *)local_438.capTable;
    reader_04._reader.data = (void *)local_438._24_8_;
    reader_04._reader.pointers = (WirePointer *)uStack_418;
    reader_04._reader.dataSize = (undefined4)local_410;
    reader_04._reader.pointerCount = local_410._4_2_;
    reader_04._reader._38_2_ = local_410._6_2_;
    reader_04._reader._40_8_ = uStack_408;
    writeConversion(this,reader_04,output);
    TextCodec::~TextCodec((TextCodec *)&local_488);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&local_3c8);
    pRVar3 = local_4a8.builder.pos;
    puVar2 = local_4a8.builder.ptr;
    if ((capnp *)local_4a8.builder.ptr != (capnp *)0x0) {
      local_4a8.builder.ptr = (uchar *)0x0;
      local_4a8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      (*(code *)**(undefined8 **)local_4a8.builder.endPtr)
                (local_4a8.builder.endPtr,puVar2,1,pRVar3,pRVar3,0);
    }
    break;
  case JSON:
    readOneJson((String *)&local_4a8,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)&local_3c8,0x400,GROW_HEURISTICALLY);
    JsonCodec::JsonCodec(&local_488);
    JsonCodec::setPrettyPrint(&local_488,this->pretty);
    JsonCodec::handleByAnnotation(&local_488,(this->rootType).super_Schema.raw);
    pRVar1 = (this->rootType).super_Schema.raw;
    MessageBuilder::getRootInternal((Builder *)&local_438,(MessageBuilder *)&local_3c8);
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
              ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)local_468,
               (EVP_PKEY_CTX *)pRVar1);
    pcVar9 = (capnp *)local_4a8.builder.pos;
    if ((capnp *)local_4a8.builder.pos != (capnp *)0x0) {
      pcVar9 = (capnp *)local_4a8.builder.ptr;
    }
    pcVar7 = (capnp *)0x0;
    if ((capnp *)local_4a8.builder.pos != (capnp *)0x0) {
      pcVar7 = (capnp *)(local_4a8.builder.pos + -1);
    }
    output_00.builder.segment = (SegmentBuilder *)local_468._8_8_;
    output_00.schema.super_Schema.raw = (Schema)(Schema)local_468._0_8_;
    output_00.builder.capTable = (CapTableBuilder *)local_458;
    output_00.builder.data = (void *)_iStack_450;
    output_00.builder.pointers = (WirePointer *)local_448;
    output_00.builder.dataSize = (undefined4)uStack_440;
    output_00.builder.pointerCount = uStack_440._4_2_;
    output_00.builder._38_2_ = uStack_440._6_2_;
    input_00.size_ = (size_t)pcVar7;
    input_00.ptr = (char *)pcVar9;
    JsonCodec::decode(&local_488,input_00,output_00);
    capnp::_::StructBuilder::asReader((StructBuilder *)(local_468 + 8));
    local_438.segment = (SegmentReader *)local_468._0_8_;
    reader_02._reader.capTable = (CapTableReader *)local_438.pointer;
    reader_02._reader.segment = (SegmentReader *)local_438.capTable;
    reader_02._reader.data = (void *)local_438._24_8_;
    reader_02._reader.pointers = (WirePointer *)uStack_418;
    reader_02._reader.dataSize = (undefined4)local_410;
    reader_02._reader.pointerCount = local_410._4_2_;
    reader_02._reader._38_2_ = local_410._6_2_;
    reader_02._reader._40_8_ = uStack_408;
    writeConversion(this,reader_02,output);
    JsonCodec::~JsonCodec(&local_488);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&local_3c8);
    pRVar3 = local_4a8.builder.pos;
    puVar2 = local_4a8.builder.ptr;
    if ((capnp *)local_4a8.builder.ptr != (capnp *)0x0) {
      local_4a8.builder.ptr = (uchar *)0x0;
      local_4a8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      (*(code *)**(undefined8 **)local_4a8.builder.endPtr)
                (local_4a8.builder.endPtr,puVar2,1,pRVar3,pRVar3,0);
    }
    break;
  default:
    kj::_::unreachable();
  }
  ParseErrorCatcher::~ParseErrorCatcher(&local_1b0);
  return;
}

Assistant:

void readOneAndConvert(kj::BufferedInputStreamWrapper& input, kj::OutputStream& output) {
    // Since this is a debug tool, lift the usual security limits.  Worse case is the process
    // crashes or has to be killed.
    ReaderOptions options;
    options.nestingLimit = kj::maxValue;
    options.traversalLimitInWords = kj::maxValue;

    ParseErrorCatcher parseErrorCatcher(context);

    switch (convertFrom) {
      case Format::BINARY: {
        capnp::InputStreamMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::PACKED: {
        capnp::PackedMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT:
      case Format::CANONICAL: {
        auto allBytes = readAll(input);

        // Technically we don't know if the bytes are aligned so we'd better copy them to a new
        // array. Note that if we have a non-whole number of words we chop off the straggler
        // bytes. This is fine because if those bytes are actually part of the message we will
        // hit an error later and if they are not then who cares?
        auto words = kj::heapArray<word>(allBytes.size() / sizeof(word));
        memcpy(words.begin(), allBytes.begin(), words.size() * sizeof(word));

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        if (convertFrom == Format::CANONICAL) {
          KJ_REQUIRE(message.isCanonical());
        }
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT_PACKED: {
        auto allBytes = readAll(input);

        auto words = kj::heapArray<word>(computeUnpackedSizeInWords(allBytes));
        kj::ArrayInputStream input(allBytes);
        capnp::_::PackedInputStream unpacker(input);
        unpacker.read(words.asBytes().begin(), words.asBytes().size());
        word dummy;
        KJ_ASSERT(unpacker.tryRead(&dummy, sizeof(dummy), sizeof(dummy)) == 0);

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::TEXT: {
        auto text = readOneText(input);
        MallocMessageBuilder message;
        TextCodec codec;
        codec.setPrettyPrint(pretty);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
      case Format::JSON: {
        auto text = readOneJson(input);
        MallocMessageBuilder message;
        JsonCodec codec;
        codec.setPrettyPrint(pretty);
        codec.handleByAnnotation(rootType);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
    }

    KJ_UNREACHABLE;
  }